

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall Instrument::get_name_abi_cxx11_(string *__return_storage_ptr__,Instrument *this)

{
  int in_EAX;
  int iVar1;
  char *__args_1;
  int local_38;
  allocator local_31;
  int length;
  
  local_38 = in_EAX;
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            (&this->ismsnoop_->get_name,this->instrument_,(char *)0x0,&local_38);
  iVar1 = -1;
  if (-2 < local_38) {
    iVar1 = local_38 + 1;
  }
  __args_1 = (char *)operator_new__((long)iVar1);
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            (&this->ismsnoop_->get_name,this->instrument_,__args_1,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__args_1,&local_31);
  operator_delete__(__args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string Instrument::get_name() const
{
	int length;

	ismsnoop_->get_name(instrument_, nullptr, &length);

	const auto c_name = new char[length + 1];
	
	ismsnoop_->get_name(instrument_, c_name, &length);

	std::string result(c_name);

	delete[] c_name;

	return result;
}